

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O0

size_type __thiscall cmList::ComputeInsertIndex(cmList *this,index_type pos,bool boundCheck)

{
  bool bVar1;
  out_of_range *poVar2;
  size_type sVar3;
  cmList *local_c0;
  size_type local_98;
  size_type local_90;
  string local_88;
  size_type local_68;
  size_type length;
  index_type index;
  string local_48;
  undefined1 local_21;
  size_type sStack_20;
  bool boundCheck_local;
  index_type pos_local;
  cmList *this_local;
  
  local_21 = boundCheck;
  sStack_20 = pos;
  pos_local = (index_type)this;
  if (boundCheck) {
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&this->Values);
    if ((bVar1) && (sStack_20 != 0)) {
      index._3_1_ = 1;
      poVar2 = (out_of_range *)__cxa_allocate_exception(0x10);
      cmStrCat<char_const(&)[8],long&,char_const(&)[21]>
                (&local_48,(char (*) [8])0xfe72b8,(long *)&stack0xffffffffffffffe0,
                 (char (*) [21])" out of range (0, 0)");
      std::out_of_range::out_of_range(poVar2,(string *)&local_48);
      index._3_1_ = 0;
      __cxa_throw(poVar2,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
    length = sStack_20;
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&this->Values);
    if (!bVar1) {
      local_68 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size(&this->Values);
      if ((long)length < 0) {
        length = local_68 + length;
      }
      if (((long)length < 0) || (local_68 < length)) {
        poVar2 = (out_of_range *)__cxa_allocate_exception(0x10);
        local_90 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size(&this->Values);
        local_98 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size(&this->Values);
        cmStrCat<char_const(&)[8],long&,char_const(&)[17],unsigned_long,char_const(&)[3],unsigned_long,char_const(&)[2]>
                  (&local_88,(char (*) [8])0xfe72b8,(long *)&stack0xffffffffffffffe0,
                   (char (*) [17])" out of range (-",&local_90,(char (*) [3])0x100c511,&local_98,
                   (char (*) [2])0x1042e4d);
        std::out_of_range::out_of_range(poVar2,(string *)&local_88);
        __cxa_throw(poVar2,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
      }
    }
    this_local = (cmList *)length;
  }
  else {
    local_c0 = (cmList *)pos;
    if (pos < 0) {
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&this->Values);
      local_c0 = (cmList *)(sVar3 + sStack_20);
    }
    this_local = local_c0;
  }
  return (size_type)this_local;
}

Assistant:

cmList::size_type cmList::ComputeInsertIndex(index_type pos,
                                             bool boundCheck) const
{
  if (boundCheck) {
    if (this->Values.empty() && pos != 0) {
      throw std::out_of_range(
        cmStrCat("index: ", pos, " out of range (0, 0)"));
    }

    auto index = pos;
    if (!this->Values.empty()) {
      auto length = this->Values.size();
      if (index < 0) {
        index = static_cast<index_type>(length) + index;
      }
      if (index < 0 || length < static_cast<size_type>(index)) {
        throw std::out_of_range(cmStrCat("index: ", pos, " out of range (-",
                                         this->Values.size(), ", ",
                                         this->Values.size(), ")"));
      }
    }
    return index;
  }

  return pos < 0 ? this->Values.size() + pos : pos;
}